

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::RestoreState(FunctionBody *this,ParseNodeFnc *pnodeFnc)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  FncFlags FVar4;
  undefined4 *puVar5;
  char16 *pcVar6;
  FncFlags FVar7;
  FncFlags FVar8;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  
  if (((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xc3b,"(this->IsReparsed())","this->IsReparsed()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  FVar7 = pnodeFnc->fncFlags;
  uVar3 = *(uint *)&this->field_0x178;
  if ((((byte)(FVar7 >> 0xe) & 1) != ((byte)(uVar3 >> 0x17) & 1)) && (DAT_0145948a == '\x01')) {
    pcVar6 = ParseableFunctionInfo::GetExternalDisplayName<Js::ParseableFunctionInfo>
                       (&this->super_ParseableFunctionInfo);
    FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_88);
    Output::Trace(DebuggerPhase,L"Child calls eval is different on debug reparse: %s(%s)\n",pcVar6,
                  (wchar (*) [42])local_88);
    FVar7 = pnodeFnc->fncFlags;
    uVar3 = *(uint *)&this->field_0x178;
  }
  if (((byte)((FVar7 & kFunctionCallsEval) >> 2) != ((byte)(uVar3 >> 0x18) & 1)) &&
     (DAT_0145948a == '\x01')) {
    pcVar6 = ParseableFunctionInfo::GetExternalDisplayName<Js::ParseableFunctionInfo>
                       (&this->super_ParseableFunctionInfo);
    FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_88);
    Output::Trace(DebuggerPhase,L"Calls eval is different on debug reparse: %s(%s)\n",pcVar6,
                  (wchar (*) [42])local_88);
    FVar7 = pnodeFnc->fncFlags;
    uVar3 = *(uint *)&this->field_0x178;
  }
  if (((byte)((FVar7 & kFunctionHasReferenceableBuiltInArguments) >> 5) !=
       ((byte)(uVar3 >> 0x19) & 1)) && (DAT_0145948a == '\x01')) {
    pcVar6 = ParseableFunctionInfo::GetExternalDisplayName<Js::ParseableFunctionInfo>
                       (&this->super_ParseableFunctionInfo);
    FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_88);
    Output::Trace(DebuggerPhase,
                  L"Referenceable Built in args is different on debug reparse: %s(%s)\n",pcVar6,
                  (wchar (*) [42])local_88);
    uVar3 = *(uint *)&this->field_0x178;
    FVar7 = pnodeFnc->fncFlags;
  }
  FVar4 = uVar3 >> 9 & kFunctionChildCallsEval;
  pnodeFnc->fncFlags =
       FVar4 | FVar7 & (kFunctionHasAnyWriteToFormals|kFunctionIsDefaultModuleExport|
                        kFunctionHasDirectSuper|kFunctionIsAsync|kFunctionIsDeclaredInParamScope|
                        kFunctionAsmjsMode|kFunctionIsGenerator|kFunctionIsStaticMember|
                        kFunctionHasDefaultArguments|kFunctionIsGeneratedDefault|kFunctionHasHomeObj
                        |kFunctionIsClassMember|kFunctionIsBaseClassConstructor|
                        kFunctionIsClassConstructor|kFunctionIsMethod|kFunctionHasSuperReference|
                        kFunctionHasNonSimpleParameterList|kFunctionIsLambda|kFunctionHasWithStmt|
                        kFunctionHasComputedName|kFunctionIsModule|kFunctionHasDestructuredParams|
                        kFunctionStrictMode|kFunctionHasNonThisStmt|kFunctionIsAccessor|
                        kFunctionHasReferenceableBuiltInArguments|kFunctionHasHeapArguments|
                        kFunctionUsesArguments|kFunctionCallsEval|kFunctionDeclaration|
                       kFunctionNested);
  FVar8 = *(uint *)&this->field_0x178 >> 0x16 & kFunctionCallsEval;
  pnodeFnc->fncFlags =
       FVar8 | FVar4 | FVar7 & (kFunctionHasAnyWriteToFormals|kFunctionIsDefaultModuleExport|
                                kFunctionHasDirectSuper|kFunctionIsAsync|
                                kFunctionIsDeclaredInParamScope|kFunctionAsmjsMode|
                                kFunctionIsGenerator|kFunctionIsStaticMember|
                                kFunctionHasDefaultArguments|kFunctionIsGeneratedDefault|
                                kFunctionHasHomeObj|kFunctionIsClassMember|
                                kFunctionIsBaseClassConstructor|kFunctionIsClassConstructor|
                                kFunctionIsMethod|kFunctionHasSuperReference|
                                kFunctionHasNonSimpleParameterList|kFunctionIsLambda|
                                kFunctionHasWithStmt|kFunctionHasComputedName|kFunctionIsModule|
                                kFunctionHasDestructuredParams|kFunctionStrictMode|
                                kFunctionHasNonThisStmt|kFunctionIsAccessor|
                                kFunctionHasReferenceableBuiltInArguments|kFunctionHasHeapArguments|
                                kFunctionUsesArguments|kFunctionDeclaration|kFunctionNested);
  pnodeFnc->fncFlags =
       *(uint *)&this->field_0x178 >> 0x14 & kFunctionHasReferenceableBuiltInArguments |
       FVar8 | FVar4 | FVar7 & (kFunctionHasAnyWriteToFormals|kFunctionIsDefaultModuleExport|
                                kFunctionHasDirectSuper|kFunctionIsAsync|
                                kFunctionIsDeclaredInParamScope|kFunctionAsmjsMode|
                                kFunctionIsGenerator|kFunctionIsStaticMember|
                                kFunctionHasDefaultArguments|kFunctionIsGeneratedDefault|
                                kFunctionHasHomeObj|kFunctionIsClassMember|
                                kFunctionIsBaseClassConstructor|kFunctionIsClassConstructor|
                                kFunctionIsMethod|kFunctionHasSuperReference|
                                kFunctionHasNonSimpleParameterList|kFunctionIsLambda|
                                kFunctionHasWithStmt|kFunctionHasComputedName|kFunctionIsModule|
                                kFunctionHasDestructuredParams|kFunctionStrictMode|
                                kFunctionHasNonThisStmt|kFunctionIsAccessor|
                                kFunctionHasHeapArguments|kFunctionUsesArguments|
                                kFunctionDeclaration|kFunctionNested);
  return;
}

Assistant:

void FunctionBody::RestoreState(ParseNodeFnc * pnodeFnc)
    {
        Assert(this->IsReparsed());
#if ENABLE_DEBUG_CONFIG_OPTIONS
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
        if(!!pnodeFnc->ChildCallsEval() != this->GetChildCallsEval())
        {
            OUTPUT_VERBOSE_TRACE(Js::DebuggerPhase, _u("Child calls eval is different on debug reparse: %s(%s)\n"), this->GetExternalDisplayName(), this->GetDebugNumberSet(debugStringBuffer));
        }
        if(!!pnodeFnc->CallsEval() != this->GetCallsEval())
        {
            OUTPUT_VERBOSE_TRACE(Js::DebuggerPhase, _u("Calls eval is different on debug reparse: %s(%s)\n"), this->GetExternalDisplayName(), this->GetDebugNumberSet(debugStringBuffer));
        }
        if(!!pnodeFnc->HasReferenceableBuiltInArguments() != this->HasReferenceableBuiltInArguments())
        {
            OUTPUT_VERBOSE_TRACE(Js::DebuggerPhase, _u("Referenceable Built in args is different on debug reparse: %s(%s)\n"), this->GetExternalDisplayName(), this->GetDebugNumberSet(debugStringBuffer));
        }

        pnodeFnc->SetChildCallsEval(this->GetChildCallsEval());
        pnodeFnc->SetCallsEval(this->GetCallsEval());
        pnodeFnc->SetHasReferenceableBuiltInArguments(this->HasReferenceableBuiltInArguments());
    }